

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlChar * xmlTextReaderConstBaseUri(xmlTextReaderPtr reader)

{
  xmlChar *name;
  xmlChar *ret;
  xmlChar *tmp;
  xmlTextReaderPtr reader_local;
  
  if ((reader == (xmlTextReaderPtr)0x0) || (reader->node == (xmlNodePtr)0x0)) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else {
    name = xmlNodeGetBase((xmlDoc *)0x0,reader->node);
    if (name == (xmlChar *)0x0) {
      reader_local = (xmlTextReaderPtr)0x0;
    }
    else {
      reader_local = (xmlTextReaderPtr)xmlDictLookup(reader->dict,name,-1);
      (*xmlFree)(name);
    }
  }
  return (xmlChar *)reader_local;
}

Assistant:

const xmlChar *
xmlTextReaderConstBaseUri(xmlTextReaderPtr reader) {
    xmlChar *tmp;
    const xmlChar *ret;

    if ((reader == NULL) || (reader->node == NULL))
	return(NULL);
    tmp = xmlNodeGetBase(NULL, reader->node);
    if (tmp == NULL)
        return(NULL);
    ret = CONSTSTR(tmp);
    xmlFree(tmp);
    return(ret);
}